

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O1

void __thiscall
t_py_generator::generate_py_struct_reader(t_py_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  pointer pptVar8;
  ostringstream result;
  string local_238;
  uint local_214;
  char *local_210;
  long local_208;
  char local_200 [16];
  t_field *local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar3 = is_immutable(&tstruct->super_t_type);
  if (bVar3) {
    t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"@classmethod",0xc);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_238,&this->super_t_generator);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"def read(cls, iprot):",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p);
    }
  }
  else {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"def read(self, iprot):",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  bVar3 = is_immutable(&tstruct->super_t_type);
  pcVar7 = "self";
  if (bVar3) {
    pcVar7 = "cls";
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "if iprot._fast_decode is not None and isinstance(iprot.trans, TTransport.CReadableTransport) and "
             ,0x61);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,4 - (ulong)bVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".thrift_spec is not None:",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  bVar3 = is_immutable(&tstruct->super_t_type);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  if (bVar3) {
    pcVar7 = "return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])";
    lVar5 = 0x3e;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    pcVar7 = "return";
    lVar5 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iprot.readStructBegin()",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  bVar3 = is_immutable(&tstruct->super_t_type);
  if ((bVar3) &&
     (pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     pptVar8 !=
     (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      ptVar2 = *pptVar8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(ptVar2->name_)._M_dataplus._M_p,
                          (ptVar2->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      if (ptVar2->value_ == (t_const_value *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"None",4);
      }
      else {
        render_field_default_value_abi_cxx11_(&local_238,this,ptVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
      }
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      std::__cxx11::stringbuf::str();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"while True:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"(fname, ftype, fid) = iprot.readFieldBegin()",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if ftype == TType.STOP:",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"break",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_214 = (uint)CONCAT71((int7)((ulong)tstruct >> 8),1);
    do {
      if ((local_214 & 1) == 0) {
        t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"elif ",5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p);
        }
        local_214 = 0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"fid == ",7);
      poVar4 = (ostream *)std::ostream::operator<<(out,(*pptVar8)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      poVar4 = t_generator::indent(&this->super_t_generator,out);
      pcVar7 = "if ftype == ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if ftype == ",0xc);
      type_to_enum_abi_cxx11_(local_1a8,(t_py_generator *)pcVar7,(*pptVar8)->type_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      bVar3 = is_immutable(&tstruct->super_t_type);
      ptVar2 = *pptVar8;
      if (bVar3) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
        generate_deserialize_field(this,out,ptVar2,&local_1e8);
        _Var6._M_p = local_1e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_00313577:
          operator_delete(_Var6._M_p);
        }
      }
      else {
        local_1f0 = ptVar2;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"self.","");
        generate_deserialize_field(this,out,local_1f0,&local_1c8);
        _Var6._M_p = local_1c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_00313577;
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"else:",5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_238,&this->super_t_generator);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_210);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_210,local_208);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iprot.skip(ftype)",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_210 != local_200) {
        operator_delete(local_210);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"else:",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_238,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
  (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_210);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_210,local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iprot.skip(ftype)",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iprot.readFieldEnd()",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar4 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iprot.readStructEnd()",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  bVar3 = is_immutable(&tstruct->super_t_type);
  if (bVar3) {
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"return cls(",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar8 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        poVar4 = t_generator::indent(&this->super_t_generator,out);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,((*pptVar8)->name_)._M_dataplus._M_p,
                            ((*pptVar8)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=",1);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,((*pptVar8)->name_)._M_dataplus._M_p,
                            ((*pptVar8)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        pptVar8 = pptVar8 + 1;
      } while (pptVar8 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_py_generator::generate_py_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (is_immutable(tstruct)) {
    out << indent() << "@classmethod" << endl << indent() << "def read(cls, iprot):" << endl;
  } else {
    indent(out) << "def read(self, iprot):" << endl;
  }
  indent_up();

  const char* id = is_immutable(tstruct) ? "cls" : "self";

  indent(out) << "if iprot._fast_decode is not None "
                 "and isinstance(iprot.trans, TTransport.CReadableTransport) "
                 "and "
              << id << ".thrift_spec is not None:" << endl;
  indent_up();

  if (is_immutable(tstruct)) {
    indent(out) << "return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])" << endl;
  } else {
    indent(out) << "iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])" << endl;
    indent(out) << "return" << endl;
  }
  indent_down();

  indent(out) << "iprot.readStructBegin()" << endl;
  
  if (is_immutable(tstruct)) {
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      t_field* tfield = *f_iter;
      std::ostringstream result;
      result << tfield->get_name() << " = ";
      if (tfield->get_value() != nullptr) {
        result << render_field_default_value(tfield);
      } else {
        result << "None";
      }
      indent(out) << result.str() << endl;
     }
  }

  // Loop over reading in fields
  indent(out) << "while True:" << endl;
  indent_up();

  // Read beginning field marker
  indent(out) << "(fname, ftype, fid) = iprot.readFieldBegin()" << endl;

  // Check for field STOP marker and break
  indent(out) << "if ftype == TType.STOP:" << endl;
  indent_up();
  indent(out) << "break" << endl;
  indent_down();

  // Switch statement on the field we are reading
  bool first = true;

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << indent() << "if ";
    } else {
      out << indent() << "elif ";
    }
    out << "fid == " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if ftype == " << type_to_enum((*f_iter)->get_type()) << ":" << endl;
    indent_up();
    if (is_immutable(tstruct)) {
      generate_deserialize_field(out, *f_iter);
    } else {
      generate_deserialize_field(out, *f_iter, "self.");
    }
    indent_down();
    out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;
    indent_down();
  }

  // In the default case we skip the field
  out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;

  // Read field end marker
  indent(out) << "iprot.readFieldEnd()" << endl;

  indent_down();

  indent(out) << "iprot.readStructEnd()" << endl;

  if (is_immutable(tstruct)) {
    indent(out) << "return cls(" << endl;
    indent_up();
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << (*f_iter)->get_name() << "=" << (*f_iter)->get_name() << "," << endl;
    }
    indent_down();
    indent(out) << ")" << endl;
  }

  indent_down();
  out << endl;
}